

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildBrBReturn
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot DestRegSlot,uint32 forInLoopLevel,
          uint32 targetOffset)

{
  code *pcVar1;
  bool bVar2;
  Opnd *srcOpnd;
  RegOpnd *destOpnd;
  BranchInstr *branchInstr;
  undefined4 *puVar3;
  undefined6 in_register_00000032;
  
  srcOpnd = BuildForInEnumeratorOpnd(this,forInLoopLevel,offset);
  destOpnd = BuildDstOpnd(this,DestRegSlot,TyVar,false,false);
  branchInstr = IR::BranchInstr::New
                          (newOpcode,&destOpnd->super_Opnd,(LabelInstr *)0x0,srcOpnd,this->m_func);
  AddBranchInstr(this,branchInstr,offset,targetOffset);
  if ((int)CONCAT62(in_register_00000032,newOpcode) == 0xe6) {
    IR::Opnd::SetValueType(&destOpnd->super_Opnd,(ValueType)0x800);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x1b25,"(false)","false");
  if (bVar2) {
    *puVar3 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
IRBuilder::BuildBrBReturn(Js::OpCode newOpcode, uint32 offset, Js::RegSlot DestRegSlot, uint32 forInLoopLevel, uint32 targetOffset)
{
    IR::Opnd *srcOpnd = this->BuildForInEnumeratorOpnd(forInLoopLevel, offset);
    IR::RegOpnd *     destOpnd = this->BuildDstOpnd(DestRegSlot);
    IR::BranchInstr * branchInstr = IR::BranchInstr::New(newOpcode, destOpnd, nullptr, srcOpnd, m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);

    switch (newOpcode)
    {
    case Js::OpCode::BrOnEmpty:
        destOpnd->SetValueType(ValueType::String);
        break;
    default:
        Assert(false);
        break;
    };
}